

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O3

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::SetIntegrationRule
          (TPZCompElWithMem<TPZInterfaceElement> *this,int ord)

{
  TPZIntPoints *pTVar1;
  int iVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TPZCompEl::SetIntegrationRule should not be called\n",0x33);
  pTVar1 = (this->super_TPZInterfaceElement).super_TPZCompEl.fIntegrationRule;
  if (pTVar1 == (TPZIntPoints *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcompel.h",
               0x254);
  }
  iVar2 = (*pTVar1->_vptr_TPZIntPoints[3])();
  if ((this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements ==
      (long)iVar2) {
    return;
  }
  (**(code **)(*(long *)&(this->super_TPZInterfaceElement).super_TPZCompEl + 0x178))(this);
  (**(code **)(*(long *)&(this->super_TPZInterfaceElement).super_TPZCompEl + 0x168))(this);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetIntegrationRule(int ord)
{
    TBASE::SetIntegrationRule(ord);
    // verify if the number of integration points changed
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    int intrulepoints = intrule.NPoints();
    if (intrulepoints != fIntPtIndices.size()) {
        SetFreeIntPtIndices();
        PrepareIntPtIndices();
    }
    
}